

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd2D.c
# Opt level: O2

void init_fdtd_2D_medium(fdtd2D *fdtd,init_medium_fun_2D permeability_invR,
                        init_medium_fun_2D permittivity_invR,void *user)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  void *pvVar5;
  uintmax_t j;
  ulong uVar6;
  float_type fVar7;
  double dVar8;
  double local_58;
  
  uVar2 = fdtd->sizeY;
  pvVar5 = fdtd->permittivity_inv;
  pvVar4 = fdtd->permeability_inv;
  local_58 = 0.0;
  lVar1 = uVar2 * 8;
  for (uVar3 = 0; uVar3 < fdtd->sizeX; uVar3 = uVar3 + 1) {
    dVar8 = 0.0;
    for (uVar6 = 0; uVar6 < uVar2; uVar6 = uVar6 + 1) {
      fVar7 = (*permeability_invR)(local_58,dVar8,user);
      *(double *)((long)pvVar4 + uVar6 * 8) = 1.0 / (fVar7 * 1.2566370614359173e-06);
      fVar7 = (*permittivity_invR)(local_58,dVar8,user);
      *(double *)((long)pvVar5 + uVar6 * 8) = 1.0 / (fVar7 * 8.85418781762039e-12);
      dVar8 = dVar8 + fdtd->dy;
      uVar2 = fdtd->sizeY;
    }
    local_58 = local_58 + fdtd->dx;
    pvVar4 = (void *)((long)pvVar4 + lVar1);
    pvVar5 = (void *)((long)pvVar5 + lVar1);
  }
  return;
}

Assistant:

void init_fdtd_2D_medium(struct fdtd2D *fdtd,
                         init_medium_fun_2D permeability_invR,
                         init_medium_fun_2D permittivity_invR, void *user) {
  VLA_2D_definition(float_type, fdtd->sizeX, fdtd->sizeY, permittivity_inv,
                    fdtd->permittivity_inv);
  VLA_2D_definition(float_type, fdtd->sizeX, fdtd->sizeY, permeability_inv,
                    fdtd->permeability_inv);
  float_type posX = float_cst(0.);
  for (uintmax_t i = 0; i < fdtd->sizeX; ++i, posX += fdtd->dx) {
    float_type posY = float_cst(0.);
    for (uintmax_t j = 0; j < fdtd->sizeY; ++j, posY += fdtd->dy) {
      permeability_inv[i][j] =
          float_cst(1.) / (permeability_invR(posX, posY, user) * mu0);
      permittivity_inv[i][j] =
          float_cst(1.) / (permittivity_invR(posX, posY, user) * eps0);
    }
  }
}